

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynchronizedOutput.cpp
# Opt level: O0

void __thiscall
Test::SynchronizedOutput::finishSuite
          (SynchronizedOutput *this,string *suiteName,uint numTests,uint numPositiveTests,
          microseconds totalDuration)

{
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> guard;
  uint numPositiveTests_local;
  uint numTests_local;
  string *suiteName_local;
  SynchronizedOutput *this_local;
  microseconds totalDuration_local;
  
  guard._M_device._0_4_ = numPositiveTests;
  guard._M_device._4_4_ = numTests;
  std::lock_guard<std::mutex>::lock_guard(&local_30,&this->outputMutex);
  (*this->realOutput->_vptr_Output[3])
            (this->realOutput,suiteName,(ulong)guard._M_device._4_4_,(ulong)(uint)guard._M_device,
             totalDuration.__r);
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return;
}

Assistant:

void SynchronizedOutput::finishSuite(const std::string &suiteName, const unsigned int numTests,
    const unsigned int numPositiveTests, const std::chrono::microseconds totalDuration) {
  std::lock_guard<std::mutex> guard(outputMutex);
  realOutput.finishSuite(suiteName, numTests, numPositiveTests, totalDuration);
}